

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaft.cpp
# Opt level: O1

void __thiscall chrono::ChShaft::ArchiveIN(ChShaft *this,ChArchiveIn *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::ChShaft>(marchive);
  ChPhysicsItem::ArchiveIN(&this->super_ChPhysicsItem,marchive);
  local_30 = &this->torque;
  local_38 = "torque";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->pos;
  local_38 = "pos";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->pos_dt;
  local_38 = "pos_dt";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->pos_dtdt;
  local_38 = "pos_dtdt";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->inertia;
  local_38 = "inertia";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = (double *)&this->fixed;
  local_38 = "fixed";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_38);
  local_30 = (double *)&this->limitspeed;
  local_38 = "limitspeed";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_38);
  local_30 = (double *)&this->max_speed;
  local_38 = "max_speed";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x28))(marchive,&local_38);
  local_30 = (double *)&this->sleep_time;
  local_38 = "sleep_time";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x28))(marchive,&local_38);
  local_30 = (double *)&this->sleep_starttime;
  local_38 = "sleep_starttime";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x28))(marchive,&local_38);
  local_30 = (double *)&this->sleep_minspeed;
  local_38 = "sleep_minspeed";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x28))(marchive,&local_38);
  local_30 = (double *)&this->sleep_minwvel;
  local_38 = "sleep_minwvel";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x28))(marchive,&local_38);
  local_30 = (double *)&this->sleeping;
  local_38 = "sleeping";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_38);
  local_30 = (double *)&this->use_sleeping;
  local_38 = "use_sleeping";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_38);
  return;
}

Assistant:

void ChShaft::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChShaft>();

    // deserialize parent class:
    ChPhysicsItem::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(torque);
    marchive >> CHNVP(pos);
    marchive >> CHNVP(pos_dt);
    marchive >> CHNVP(pos_dtdt);
    marchive >> CHNVP(inertia);
    marchive >> CHNVP(fixed);
    marchive >> CHNVP(limitspeed);
    marchive >> CHNVP(max_speed);
    marchive >> CHNVP(sleep_time);
    marchive >> CHNVP(sleep_starttime);
    marchive >> CHNVP(sleep_minspeed);
    marchive >> CHNVP(sleep_minwvel);
    marchive >> CHNVP(sleeping);
    marchive >> CHNVP(use_sleeping);
}